

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::(anonymous_namespace)::
     TraverseShaderRec<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>>
               (string *path_prefix,Prim *prim,uint32_t depth,
               PathShaderMap<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_> *itemmap)

{
  bool bVar1;
  Path *this;
  mapped_type *this_00;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this_01;
  reference prim_00;
  Prim *child;
  const_iterator __end3;
  const_iterator __begin3;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range3;
  UsdPrimvarReader<tinyusdz::value::matrix4d> *local_a0;
  UsdPrimvarReader<tinyusdz::value::matrix4d> *s;
  Shader *ps;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  undefined1 local_50 [8];
  string prim_abs_path;
  PathShaderMap<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_> *itemmap_local;
  uint32_t depth_local;
  Prim *prim_local;
  string *path_prefix_local;
  
  if (depth < 0x20001) {
    prim_abs_path.field_2._8_8_ = itemmap;
    ::std::operator+(local_70,(char *)path_prefix);
    this = Prim::local_path(prim);
    Path::full_path_name_abi_cxx11_((string *)&ps,this);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     local_70);
    ::std::__cxx11::string::~string((string *)&ps);
    ::std::__cxx11::string::~string((string *)local_70);
    s = (UsdPrimvarReader<tinyusdz::value::matrix4d> *)Prim::as<tinyusdz::Shader>(prim);
    if ((s != (UsdPrimvarReader<tinyusdz::value::matrix4d> *)0x0) &&
       (local_a0 = tinyusdz::value::Value::as<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>>
                             ((Value *)&(s->fallback)._metas.comment.contained,false),
       local_a0 != (UsdPrimvarReader<tinyusdz::value::matrix4d> *)0x0)) {
      ___range3 = ::std::
                  make_pair<tinyusdz::Shader_const*&,tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>const*&>
                            ((Shader **)&s,&local_a0);
      this_00 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_tinyusdz::Shader_*,_const_tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_tinyusdz::Shader_*,_const_tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_*>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_tinyusdz::Shader_*,_const_tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_tinyusdz::Shader_*,_const_tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_*>_>_>_>
                              *)prim_abs_path.field_2._8_8_,(key_type *)local_50);
      ::std::
      pair<const_tinyusdz::Shader_*,_const_tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_*>
      ::operator=(this_00,(type)&__range3);
    }
    this_01 = Prim::children(prim);
    __end3._M_current =
         (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin(this_01);
    child = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                       *)&child), bVar1) {
      prim_00 = __gnu_cxx::
                __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                ::operator*(&__end3);
      bVar1 = TraverseShaderRec<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>>
                        ((string *)local_50,prim_00,depth + 1,
                         (PathShaderMap<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_> *)
                         prim_abs_path.field_2._8_8_);
      if (!bVar1) {
        path_prefix_local._7_1_ = false;
        goto LAB_007d4b4e;
      }
      __gnu_cxx::
      __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
      ::operator++(&__end3);
    }
    path_prefix_local._7_1_ = true;
LAB_007d4b4e:
    ::std::__cxx11::string::~string((string *)local_50);
  }
  else {
    path_prefix_local._7_1_ = false;
  }
  return path_prefix_local._7_1_;
}

Assistant:

bool TraverseShaderRec(const std::string &path_prefix,
                       const tinyusdz::Prim &prim, uint32_t depth,
                       PathShaderMap<ShaderTy> &itemmap) {
  if (depth > 1024 * 128) {
    // Too deep
    return false;
  }

  std::string prim_abs_path =
      path_prefix + "/" + prim.local_path().full_path_name();

  // First check if type is Shader Prim.
  if (const Shader *ps = prim.as<Shader>()) {
    // Then check if wanted Shder type
    if (const ShaderTy *s = ps->value.as<ShaderTy>()) {
      itemmap[prim_abs_path] = std::make_pair(ps, s);
    }
  }

  for (const auto &child : prim.children()) {
    if (!TraverseShaderRec(prim_abs_path, child, depth + 1, itemmap)) {
      return false;
    }
  }

  return true;
}